

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

NodeSequence __thiscall
GraphBuilder::insertUndefinedFunction
          (GraphBuilder *this,Function *function,CallInst *callInstruction)

{
  bool bVar1;
  char *in_RDI;
  undefined1 auVar2 [16];
  NodeSequence NVar3;
  GraphBuilder *unaff_retaddr;
  string funcName;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  string local_48 [16];
  StringRef *in_stack_ffffffffffffffc8;
  CallInst *local_10;
  CallInst *callInstruction_00;
  
  callInstruction_00 = local_10;
  auVar2 = llvm::Value::getName();
  llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffffc8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
  if (bVar1) {
    NVar3 = insertPthreadCreate(unaff_retaddr,callInstruction_00);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
    if (bVar1) {
      NVar3 = insertPthreadJoin(auVar2._8_8_,auVar2._0_8_);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
      if (bVar1) {
        NVar3 = insertPthreadExit(auVar2._8_8_,auVar2._0_8_);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                in_RDI);
        if (bVar1) {
          NVar3 = insertPthreadMutexLock(auVar2._8_8_,auVar2._0_8_);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  in_RDI);
          if (bVar1) {
            NVar3 = insertPthreadMutexUnlock(auVar2._8_8_,auVar2._0_8_);
          }
          else {
            NVar3 = buildGeneralCallInstruction(auVar2._8_8_,auVar2._0_8_);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_48);
  return NVar3;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertUndefinedFunction(const Function *function,
                                      const CallInst *callInstruction) {
    std::string funcName = function->getName().str();

    if (funcName == "pthread_create") {
        return insertPthreadCreate(callInstruction);
    }
    if (funcName == "pthread_join") {
        return insertPthreadJoin(callInstruction);
    }
    if (funcName == "pthread_exit") {
        return insertPthreadExit(callInstruction);
    }
    if (funcName == "pthread_mutex_lock") {
        return insertPthreadMutexLock(callInstruction);
    } else if (funcName == "pthread_mutex_unlock") {
        return insertPthreadMutexUnlock(callInstruction);
    } else {
        return buildGeneralCallInstruction(callInstruction);
    }
}